

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  Ref<embree::Geometry> *pRVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  byte bVar16;
  ulong *puVar17;
  byte bVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  Geometry *pGVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  byte bVar29;
  ulong uVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar31 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2460;
  uint local_2454;
  ulong local_2448;
  undefined1 local_23d8 [16];
  undefined1 local_23c8 [16];
  undefined1 local_23b8 [16];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  size_t local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  puVar17 = local_2368;
  local_2378 = root.ptr;
  local_2370[0] = 0;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar61._4_4_ = fVar2;
  auVar61._0_4_ = fVar2;
  auVar61._8_4_ = fVar2;
  auVar61._12_4_ = fVar2;
  auVar61._16_4_ = fVar2;
  auVar61._20_4_ = fVar2;
  auVar61._24_4_ = fVar2;
  auVar61._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar62._4_4_ = fVar3;
  auVar62._0_4_ = fVar3;
  auVar62._8_4_ = fVar3;
  auVar62._12_4_ = fVar3;
  auVar62._16_4_ = fVar3;
  auVar62._20_4_ = fVar3;
  auVar62._24_4_ = fVar3;
  auVar62._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar63._4_4_ = fVar4;
  auVar63._0_4_ = fVar4;
  auVar63._8_4_ = fVar4;
  auVar63._12_4_ = fVar4;
  auVar63._16_4_ = fVar4;
  auVar63._20_4_ = fVar4;
  auVar63._24_4_ = fVar4;
  auVar63._28_4_ = fVar4;
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = fVar4 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar69 = ZEXT3264(auVar50);
  auVar64._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar64._8_4_ = -fVar2;
  auVar64._12_4_ = -fVar2;
  auVar64._16_4_ = -fVar2;
  auVar64._20_4_ = -fVar2;
  auVar64._24_4_ = -fVar2;
  auVar64._28_4_ = -fVar2;
  auVar65._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar3;
  auVar65._12_4_ = -fVar3;
  auVar65._16_4_ = -fVar3;
  auVar65._20_4_ = -fVar3;
  auVar65._24_4_ = -fVar3;
  auVar65._28_4_ = -fVar3;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar66._4_4_ = iVar5;
  auVar66._0_4_ = iVar5;
  auVar66._8_4_ = iVar5;
  auVar66._12_4_ = iVar5;
  auVar66._16_4_ = iVar5;
  auVar66._20_4_ = iVar5;
  auVar66._24_4_ = iVar5;
  auVar66._28_4_ = iVar5;
  auVar67._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  auVar67._8_4_ = -fVar4;
  auVar67._12_4_ = -fVar4;
  auVar67._16_4_ = -fVar4;
  auVar67._20_4_ = -fVar4;
  auVar67._24_4_ = -fVar4;
  auVar67._28_4_ = -fVar4;
  auVar50 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar68._8_4_ = 0xfffffff8;
  auVar68._0_8_ = 0xfffffff8fffffff8;
  auVar68._12_4_ = 0xfffffff8;
  auVar68._16_4_ = 0xfffffff8;
  auVar68._20_4_ = 0xfffffff8;
  auVar68._24_4_ = 0xfffffff8;
  auVar68._28_4_ = 0xfffffff8;
  do {
    pfVar1 = (float *)(puVar17 + -1);
    puVar17 = puVar17 + -2;
    if (*pfVar1 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar30 = *puVar17;
      while ((uVar30 & 8) == 0) {
        auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar25),auVar64,auVar61);
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar30 + 0x40 + uVar26),auVar65,auVar62);
        auVar53 = vpmaxsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar32));
        auVar51 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar30 + 0x40 + uVar27),auVar67,auVar63);
        auVar51 = vpmaxsd_avx512vl(auVar51,auVar66);
        auVar51 = vpmaxsd_avx512vl(auVar53,auVar51);
        auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar30 + 0x40 + (uVar25 ^ 0x20)),auVar64,
                                  auVar61);
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar30 + 0x40 + (uVar26 ^ 0x20)),auVar65,
                                  auVar62);
        auVar53 = vpminsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar32));
        auVar52 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar30 + 0x40 + (uVar27 ^ 0x20)),auVar67,auVar63
                            );
        auVar52 = vpminsd_avx512vl(auVar52,auVar69._0_32_);
        auVar53 = vpminsd_avx2(auVar53,auVar52);
        uVar28 = vpcmpd_avx512vl(auVar51,auVar53,2);
        bVar18 = (byte)uVar28;
        if (bVar18 == 0) goto LAB_0077fb5b;
        auVar53 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(uVar30 & 0xfffffffffffffff0));
        auVar52 = vmovdqu64_avx512vl(((undefined1 (*) [32])(uVar30 & 0xfffffffffffffff0))[1]);
        auVar54 = vmovdqa64_avx512vl(auVar50);
        auVar54 = vpternlogd_avx512vl(auVar54,auVar51,auVar68,0xf8);
        auVar55 = vpcompressd_avx512vl(auVar54);
        auVar60._0_4_ =
             (uint)(bVar18 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar54._0_4_;
        bVar11 = (bool)((byte)(uVar28 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar11 * auVar55._4_4_ | (uint)!bVar11 * auVar54._4_4_;
        bVar11 = (bool)((byte)(uVar28 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar11 * auVar55._8_4_ | (uint)!bVar11 * auVar54._8_4_;
        bVar11 = (bool)((byte)(uVar28 >> 3) & 1);
        auVar60._12_4_ = (uint)bVar11 * auVar55._12_4_ | (uint)!bVar11 * auVar54._12_4_;
        bVar11 = (bool)((byte)(uVar28 >> 4) & 1);
        auVar60._16_4_ = (uint)bVar11 * auVar55._16_4_ | (uint)!bVar11 * auVar54._16_4_;
        bVar11 = (bool)((byte)(uVar28 >> 5) & 1);
        auVar60._20_4_ = (uint)bVar11 * auVar55._20_4_ | (uint)!bVar11 * auVar54._20_4_;
        bVar11 = (bool)((byte)(uVar28 >> 6) & 1);
        auVar60._24_4_ = (uint)bVar11 * auVar55._24_4_ | (uint)!bVar11 * auVar54._24_4_;
        bVar11 = SUB81(uVar28 >> 7,0);
        auVar60._28_4_ = (uint)bVar11 * auVar55._28_4_ | (uint)!bVar11 * auVar54._28_4_;
        auVar54 = vmovdqa64_avx512vl(auVar53);
        auVar54 = vpermt2q_avx512vl(auVar54,auVar60,auVar52);
        uVar30 = auVar54._0_8_;
        bVar18 = bVar18 - 1 & bVar18;
        if (bVar18 != 0) {
          auVar54 = vpshufd_avx512vl(auVar60,0x55);
          auVar55 = vmovdqa64_avx512vl(auVar53);
          vpermt2q_avx512vl(auVar55,auVar54,auVar52);
          auVar55 = vpminsd_avx512vl(auVar60,auVar54);
          auVar54 = vpmaxsd_avx512vl(auVar60,auVar54);
          bVar18 = bVar18 - 1 & bVar18;
          if (bVar18 == 0) {
            auVar55 = vpermi2q_avx512vl(auVar55,auVar53,auVar52);
            uVar30 = auVar55._0_8_;
            auVar53 = vpermt2q_avx512vl(auVar53,auVar54,auVar52);
            *puVar17 = auVar53._0_8_;
            auVar53 = vpermd_avx512vl(auVar54,auVar51);
            *(int *)(puVar17 + 1) = auVar53._0_4_;
            puVar17 = puVar17 + 2;
          }
          else {
            auVar56 = vpshufd_avx512vl(auVar60,0xaa);
            auVar57 = vmovdqa64_avx512vl(auVar53);
            vpermt2q_avx512vl(auVar57,auVar56,auVar52);
            auVar57 = vpminsd_avx512vl(auVar55,auVar56);
            auVar55 = vpmaxsd_avx512vl(auVar55,auVar56);
            auVar56 = vpminsd_avx512vl(auVar54,auVar55);
            auVar54 = vpmaxsd_avx512vl(auVar54,auVar55);
            bVar18 = bVar18 - 1 & bVar18;
            if (bVar18 == 0) {
              auVar55 = vpermi2q_avx512vl(auVar57,auVar53,auVar52);
              uVar30 = auVar55._0_8_;
              auVar55 = vmovdqa64_avx512vl(auVar53);
              auVar55 = vpermt2q_avx512vl(auVar55,auVar54,auVar52);
              *puVar17 = auVar55._0_8_;
              auVar54 = vpermd_avx512vl(auVar54,auVar51);
              *(int *)(puVar17 + 1) = auVar54._0_4_;
              auVar53 = vpermt2q_avx512vl(auVar53,auVar56,auVar52);
              puVar17[2] = auVar53._0_8_;
              auVar53 = vpermd_avx512vl(auVar56,auVar51);
              *(int *)(puVar17 + 3) = auVar53._0_4_;
              puVar17 = puVar17 + 4;
            }
            else {
              auVar55 = vpshufd_avx512vl(auVar60,0xff);
              auVar58 = vmovdqa64_avx512vl(auVar53);
              vpermt2q_avx512vl(auVar58,auVar55,auVar52);
              auVar58 = vpminsd_avx512vl(auVar57,auVar55);
              auVar55 = vpmaxsd_avx2(auVar57,auVar55);
              auVar57 = vpminsd_avx512vl(auVar56,auVar55);
              auVar55 = vpmaxsd_avx512vl(auVar56,auVar55);
              auVar56 = vpminsd_avx512vl(auVar54,auVar55);
              auVar54 = vpmaxsd_avx512vl(auVar54,auVar55);
              bVar18 = bVar18 - 1 & bVar18;
              if (bVar18 == 0) {
                auVar55 = vpermi2q_avx512vl(auVar58,auVar53,auVar52);
                uVar30 = auVar55._0_8_;
                auVar55 = vmovdqa64_avx512vl(auVar53);
                auVar55 = vpermt2q_avx512vl(auVar55,auVar54,auVar52);
                *puVar17 = auVar55._0_8_;
                auVar54 = vpermd_avx512vl(auVar54,auVar51);
                *(int *)(puVar17 + 1) = auVar54._0_4_;
                auVar54 = vmovdqa64_avx512vl(auVar53);
                auVar54 = vpermt2q_avx512vl(auVar54,auVar56,auVar52);
                puVar17[2] = auVar54._0_8_;
                auVar54 = vpermd_avx512vl(auVar56,auVar51);
                *(int *)(puVar17 + 3) = auVar54._0_4_;
                auVar53 = vpermt2q_avx512vl(auVar53,auVar57,auVar52);
                puVar17[4] = auVar53._0_8_;
                auVar53 = vpermd_avx512vl(auVar57,auVar51);
                *(int *)(puVar17 + 5) = auVar53._0_4_;
                puVar17 = puVar17 + 6;
              }
              else {
                auVar59 = valignd_avx512vl(auVar60,auVar60,3);
                auVar31 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                auVar55 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar60 = vpermt2d_avx512vl(ZEXT1632(auVar31),auVar55,auVar58);
                auVar55 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar60 = vpermt2d_avx512vl(auVar60,auVar55,auVar57);
                auVar60 = vpermt2d_avx512vl(auVar60,auVar55,auVar56);
                auVar55 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar54 = vpermt2d_avx512vl(auVar60,auVar55,auVar54);
                auVar70 = ZEXT3264(auVar54);
                bVar29 = bVar18;
                do {
                  auVar54 = vmovdqa64_avx512vl(auVar70._0_32_);
                  auVar55._8_4_ = 1;
                  auVar55._0_8_ = 0x100000001;
                  auVar55._12_4_ = 1;
                  auVar55._16_4_ = 1;
                  auVar55._20_4_ = 1;
                  auVar55._24_4_ = 1;
                  auVar55._28_4_ = 1;
                  auVar55 = vpermd_avx512vl(auVar55,auVar59);
                  auVar59 = valignd_avx512vl(auVar59,auVar59,1);
                  auVar60 = vmovdqa64_avx512vl(auVar53);
                  vpermt2q_avx512vl(auVar60,auVar59,auVar52);
                  bVar29 = bVar29 - 1 & bVar29;
                  uVar15 = vpcmpd_avx512vl(auVar55,auVar54,5);
                  auVar55 = vpmaxsd_avx512vl(auVar55,auVar54);
                  bVar16 = (byte)uVar15 << 1;
                  auVar60 = valignd_avx512vl(auVar54,auVar54,7);
                  bVar11 = (bool)((byte)uVar15 & 1);
                  auVar54._4_4_ = (uint)bVar11 * auVar60._4_4_ | (uint)!bVar11 * auVar55._4_4_;
                  auVar54._0_4_ = auVar55._0_4_;
                  bVar11 = (bool)(bVar16 >> 2 & 1);
                  auVar54._8_4_ = (uint)bVar11 * auVar60._8_4_ | (uint)!bVar11 * auVar55._8_4_;
                  bVar11 = (bool)(bVar16 >> 3 & 1);
                  auVar54._12_4_ = (uint)bVar11 * auVar60._12_4_ | (uint)!bVar11 * auVar55._12_4_;
                  bVar11 = (bool)(bVar16 >> 4 & 1);
                  auVar54._16_4_ = (uint)bVar11 * auVar60._16_4_ | (uint)!bVar11 * auVar55._16_4_;
                  bVar11 = (bool)(bVar16 >> 5 & 1);
                  auVar54._20_4_ = (uint)bVar11 * auVar60._20_4_ | (uint)!bVar11 * auVar55._20_4_;
                  bVar11 = (bool)(bVar16 >> 6 & 1);
                  auVar54._24_4_ = (uint)bVar11 * auVar60._24_4_ | (uint)!bVar11 * auVar55._24_4_;
                  auVar54._28_4_ =
                       (uint)(bVar16 >> 7) * auVar60._28_4_ |
                       (uint)!(bool)(bVar16 >> 7) * auVar55._28_4_;
                  auVar70 = ZEXT3264(auVar54);
                } while (bVar29 != 0);
                lVar19 = (ulong)(uint)POPCOUNT((uint)bVar18) + 3;
                auVar54 = vmovdqa64_avx512vl(auVar54);
                do {
                  auVar54 = vpermi2q_avx512vl(auVar54,auVar53,auVar52);
                  *puVar17 = auVar54._0_8_;
                  auVar55 = auVar70._0_32_;
                  auVar54 = vpermd_avx512vl(auVar55,auVar51);
                  *(int *)(puVar17 + 1) = auVar54._0_4_;
                  auVar54 = valignd_avx512vl(auVar55,auVar55,1);
                  puVar17 = puVar17 + 2;
                  auVar55 = vmovdqa64_avx512vl(auVar54);
                  auVar70 = ZEXT3264(auVar55);
                  lVar19 = lVar19 + -1;
                } while (lVar19 != 0);
                auVar53 = vpermt2q_avx512vl(auVar53,auVar54,auVar52);
                uVar30 = auVar53._0_8_;
              }
            }
          }
        }
      }
      uVar28 = (ulong)((uint)uVar30 & 0xf);
      if (uVar28 != 8) {
        uVar6 = *(undefined4 *)(ray + k * 4);
        auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
        uVar30 = uVar30 & 0xfffffffffffffff0;
        auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        lVar19 = 0;
        do {
          lVar20 = lVar19 * 0xb0;
          auVar46 = *(undefined1 (*) [16])(uVar30 + 0x80 + lVar20);
          auVar47 = *(undefined1 (*) [16])(uVar30 + 0x40 + lVar20);
          auVar48 = *(undefined1 (*) [16])(uVar30 + 0x70 + lVar20);
          auVar49 = *(undefined1 (*) [16])(uVar30 + 0x50 + lVar20);
          auVar36 = vmulps_avx512vl(auVar47,auVar46);
          local_23a8 = vfmsub231ps_avx512vl(auVar36,auVar48,auVar49);
          auVar36 = *(undefined1 (*) [16])(uVar30 + 0x60 + lVar20);
          auVar9._4_4_ = uVar6;
          auVar9._0_4_ = uVar6;
          auVar9._8_4_ = uVar6;
          auVar9._12_4_ = uVar6;
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + lVar20),auVar9);
          auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x10 + lVar20),auVar31);
          auVar9 = *(undefined1 (*) [16])(uVar30 + 0x30 + lVar20);
          auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar30 + 0x20 + lVar20),auVar32);
          auVar40 = vmulps_avx512vl(auVar49,auVar36);
          local_2398 = vfmsub231ps_avx512vl(auVar40,auVar46,auVar9);
          auVar40 = vmulps_avx512vl(auVar9,auVar48);
          local_2388 = vfmsub231ps_avx512vl(auVar40,auVar36,auVar47);
          auVar40 = vmulps_avx512vl(auVar34,auVar39);
          auVar41 = vfmsub231ps_avx512vl(auVar40,auVar38,auVar35);
          auVar40 = vmulps_avx512vl(auVar35,auVar37);
          auVar42 = vfmsub231ps_avx512vl(auVar40,auVar39,auVar33);
          auVar40 = vmulps_avx512vl(auVar33,auVar38);
          auVar43 = vfmsub231ps_avx512vl(auVar40,auVar37,auVar34);
          auVar40 = vmulps_avx512vl(local_2388,auVar35);
          auVar40 = vfmadd231ps_avx512vl(auVar40,local_2398,auVar34);
          auVar44 = vfmadd231ps_avx512vl(auVar40,local_23a8,auVar33);
          auVar40._8_4_ = 0x7fffffff;
          auVar40._0_8_ = 0x7fffffff7fffffff;
          auVar40._12_4_ = 0x7fffffff;
          auVar40 = vandps_avx512vl(auVar44,auVar40);
          auVar45._8_4_ = 0x80000000;
          auVar45._0_8_ = 0x8000000080000000;
          auVar45._12_4_ = 0x80000000;
          auVar45 = vandps_avx512vl(auVar44,auVar45);
          auVar46 = vmulps_avx512vl(auVar46,auVar43);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar42,auVar48);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar41,auVar36);
          auVar46 = vxorps_avx512vl(auVar45,auVar46);
          auVar48._0_4_ = auVar49._0_4_ * auVar43._0_4_;
          auVar48._4_4_ = auVar49._4_4_ * auVar43._4_4_;
          auVar48._8_4_ = auVar49._8_4_ * auVar43._8_4_;
          auVar48._12_4_ = auVar49._12_4_ * auVar43._12_4_;
          auVar47 = vfmadd231ps_avx512vl(auVar48,auVar47,auVar42);
          auVar47 = vfmadd231ps_avx512vl(auVar47,auVar9,auVar41);
          auVar47 = vxorps_avx512vl(auVar45,auVar47);
          auVar48 = ZEXT816(0) << 0x20;
          uVar15 = vcmpps_avx512vl(auVar46,auVar48,5);
          uVar12 = vcmpps_avx512vl(auVar47,auVar48,5);
          uVar13 = vcmpps_avx512vl(auVar44,auVar48,4);
          auVar48 = vaddps_avx512vl(auVar46,auVar47);
          uVar14 = vcmpps_avx512vl(auVar48,auVar40,2);
          bVar18 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
          if (bVar18 != 0) {
            auVar48 = vmulps_avx512vl(local_2388,auVar39);
            auVar48 = vfmadd213ps_avx512vl(auVar38,local_2398,auVar48);
            auVar48 = vfmadd213ps_avx512vl(auVar37,local_23a8,auVar48);
            auVar48 = vxorps_avx512vl(auVar45,auVar48);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar49._4_4_ = uVar7;
            auVar49._0_4_ = uVar7;
            auVar49._8_4_ = uVar7;
            auVar49._12_4_ = uVar7;
            auVar49 = vmulps_avx512vl(auVar40,auVar49);
            uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar36._4_4_ = uVar7;
            auVar36._0_4_ = uVar7;
            auVar36._8_4_ = uVar7;
            auVar36._12_4_ = uVar7;
            auVar36 = vmulps_avx512vl(auVar40,auVar36);
            uVar15 = vcmpps_avx512vl(auVar48,auVar36,2);
            uVar12 = vcmpps_avx512vl(auVar49,auVar48,1);
            bVar18 = (byte)uVar15 & (byte)uVar12 & bVar18;
            if (bVar18 != 0) {
              auVar49 = vrcp14ps_avx512vl(auVar40);
              auVar37._8_4_ = 0x3f800000;
              auVar37._0_8_ = 0x3f8000003f800000;
              auVar37._12_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_avx512vl(auVar40,auVar49,auVar37);
              auVar49 = vfmadd132ps_avx512vl(auVar36,auVar49,auVar49);
              local_23b8 = vmulps_avx512vl(auVar49,auVar48);
              local_23d8 = vmulps_avx512vl(auVar49,auVar46);
              local_23c8 = vmulps_avx512vl(auVar49,auVar47);
              lVar20 = lVar20 + uVar30;
              auVar46._8_4_ = 0x7f800000;
              auVar46._0_8_ = 0x7f8000007f800000;
              auVar46._12_4_ = 0x7f800000;
              auVar46 = vblendmps_avx512vl(auVar46,local_23b8);
              auVar38._0_4_ =
                   (uint)(bVar18 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar18 >> 1 & 1);
              auVar38._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar18 >> 2 & 1);
              auVar38._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar18 >> 3 & 1);
              auVar38._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * 0x7f800000;
              auVar46 = vshufps_avx(auVar38,auVar38,0xb1);
              auVar46 = vminps_avx(auVar46,auVar38);
              auVar47 = vshufpd_avx(auVar46,auVar46,1);
              auVar46 = vminps_avx(auVar47,auVar46);
              uVar15 = vcmpps_avx512vl(auVar38,auVar46,0);
              local_2454 = (uint)bVar18;
              if (((byte)uVar15 & bVar18) != 0) {
                bVar18 = (byte)uVar15 & bVar18;
              }
              uVar22 = 0;
              for (uVar21 = (uint)bVar18; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
                uVar22 = uVar22 + 1;
              }
              local_2460 = (ulong)uVar22;
              pRVar10 = (context->scene->geometries).items;
              local_2448 = (ulong)*(uint *)(lVar20 + 0x90 + local_2460 * 4);
              pGVar23 = pRVar10[local_2448].ptr;
              while ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar18 = (byte)(1 << ((uint)local_2460 & 0x1f));
                if ((~bVar18 & (byte)local_2454) == 0) goto LAB_0077f87d;
                bVar18 = ~bVar18 & (byte)local_2454;
                local_2454 = (uint)bVar18;
                auVar47._8_4_ = 0x7f800000;
                auVar47._0_8_ = 0x7f8000007f800000;
                auVar47._12_4_ = 0x7f800000;
                auVar46 = vblendmps_avx512vl(auVar47,local_23b8);
                auVar39._0_4_ =
                     (uint)(bVar18 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar18 & 1) * 0x7f800000;
                bVar11 = (bool)(bVar18 >> 1 & 1);
                auVar39._4_4_ = (uint)bVar11 * auVar46._4_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)(bVar18 >> 2 & 1);
                auVar39._8_4_ = (uint)bVar11 * auVar46._8_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)(bVar18 >> 3 & 1);
                auVar39._12_4_ = (uint)bVar11 * auVar46._12_4_ | (uint)!bVar11 * 0x7f800000;
                auVar46 = vshufps_avx(auVar39,auVar39,0xb1);
                auVar46 = vminps_avx(auVar46,auVar39);
                auVar47 = vshufpd_avx(auVar46,auVar46,1);
                auVar46 = vminps_avx(auVar47,auVar46);
                uVar15 = vcmpps_avx512vl(auVar39,auVar46,0);
                bVar18 = (byte)uVar15 & bVar18;
                uVar22 = local_2454;
                if (bVar18 != 0) {
                  uVar22 = (uint)bVar18;
                }
                uVar21 = 0;
                for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                  uVar21 = uVar21 + 1;
                }
                local_2460 = (ulong)uVar21;
                local_2448 = (ulong)*(uint *)(lVar20 + 0x90 + local_2460 * 4);
                pGVar23 = pRVar10[local_2448].ptr;
              }
              uVar24 = (ulong)((uint)local_2460 << 2);
              uVar7 = *(undefined4 *)(local_23d8 + uVar24);
              uVar8 = *(undefined4 *)(local_23c8 + uVar24);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_23b8 + uVar24);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_23a8 + uVar24);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2398 + uVar24);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2388 + uVar24);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar7;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)(lVar20 + 0xa0 + uVar24);
              *(int *)(ray + k * 4 + 0x120) = (int)local_2448;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
          }
LAB_0077f87d:
          lVar19 = lVar19 + 1;
        } while (lVar19 != uVar28 - 8);
      }
      auVar53 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
      auVar69 = ZEXT3264(auVar53);
    }
LAB_0077fb5b:
    if (puVar17 == &local_2378) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }